

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerpIntercept.cpp
# Opt level: O1

LLPoint GeoCalcs::PerpIntercept
                  (LLPoint *llPt1,double dCrs13,LLPoint *llPt2,double *dCrsFromPt,
                  double *dDistFromPt,double dTol)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  LLPoint LVar6;
  double dist13;
  double distarray [2];
  double errarray [2];
  InverseResult result;
  LLPoint pt1;
  LLPoint pt2;
  double local_118;
  double local_110;
  double local_108;
  uint uStack_fc;
  double local_f0;
  double local_e8;
  double local_e0;
  LLPoint local_d8;
  InverseResult local_c8;
  LLPoint local_a8;
  double local_90;
  LLPoint local_88;
  double local_70;
  double *local_68;
  double *local_60;
  undefined1 local_58 [16];
  LLPoint local_48;
  
  local_c8.azimuth = 0.0;
  local_c8.reverseAzimuth = 0.0;
  local_c8.distance = 0.0;
  local_88.latitude = llPt1->latitude;
  local_88.longitude = llPt1->longitude;
  local_48.latitude = llPt2->latitude;
  local_48.longitude = llPt2->longitude;
  local_110 = dCrs13;
  local_90 = dTol;
  DistVincenty(&local_88,&local_48,&local_c8);
  if (local_c8.distance <= local_90) {
    *dDistFromPt = 0.0;
    *dCrsFromPt = 0.0;
    local_a8.latitude = local_88.latitude;
    local_a8.longitude = local_88.longitude;
    goto LAB_0015a6c8;
  }
  local_108 = SignAzimuthDifference(local_110,local_c8.azimuth);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = local_108;
  local_58._12_4_ = extraout_XMM0_Dd;
  uStack_fc = extraout_XMM0_Dd & 0x7fffffff;
  local_108 = ABS(local_108);
  local_f0 = kSphereRadius;
  local_70 = tan(local_c8.distance / kSphereRadius);
  dVar1 = cos((double)local_58._0_8_);
  local_118 = atan(ABS(dVar1) * local_70);
  local_118 = local_118 * local_f0;
  local_68 = dCrsFromPt;
  local_60 = dDistFromPt;
  if (local_108 <= 1.5707963267948966) {
    if (ABS(local_118) < 277800.0) {
      local_d8.latitude = 0.0;
      local_d8.longitude = 0.0;
      LVar6 = DestVincenty(&local_88,local_110 + 3.141592653589793,277800.0);
      local_d8.latitude = LVar6.latitude;
      local_d8.longitude = LVar6.longitude;
      local_118 = local_118 + 277800.0;
      goto LAB_0015a42a;
    }
    uVar4 = SUB84(local_110,0);
    uVar5 = (undefined4)((ulong)local_110 >> 0x20);
  }
  else {
    local_d8.latitude = 0.0;
    local_d8.longitude = 0.0;
    LVar6 = DestVincenty(&local_88,local_110 + 3.141592653589793,local_118 + 277800.0);
    local_d8.latitude = LVar6.latitude;
    local_d8.longitude = LVar6.longitude;
    local_118 = 277800.0;
LAB_0015a42a:
    DistVincenty(&local_d8,&local_88,&local_c8);
    uVar4 = SUB84(local_c8.azimuth,0);
    uVar5 = (undefined4)((ulong)local_c8.azimuth >> 0x20);
    local_88.latitude = local_d8.latitude;
    local_88.longitude = local_d8.longitude;
  }
  local_110 = (double)CONCAT44(uVar5,uVar4);
  LVar6 = DestVincenty(&local_88,(double)CONCAT44(uVar5,uVar4),local_118);
  local_a8.latitude = LVar6.latitude;
  local_a8.longitude = LVar6.longitude;
  DistVincenty(&local_a8,&local_88,&local_c8);
  local_108 = local_c8.azimuth;
  DistVincenty(&local_a8,&local_48,&local_c8);
  local_f0 = local_c8.distance;
  dVar1 = SignAzimuthDifference(local_108,local_c8.azimuth);
  local_d8.latitude = ABS(dVar1) + -1.5707963267948966;
  local_e8 = local_118;
  local_e0 = ABS(local_d8.latitude * local_f0 + local_118);
  LVar6 = DestVincenty(&local_88,local_110,local_e0);
  local_a8.latitude = LVar6.latitude;
  local_a8.longitude = LVar6.longitude;
  DistVincenty(&local_a8,&local_88,&local_c8);
  local_108 = local_c8.azimuth;
  DistVincenty(&local_a8,&local_48,&local_c8);
  dVar1 = local_108;
  local_108 = local_c8.azimuth;
  dVar1 = SignAzimuthDifference(dVar1,local_c8.azimuth);
  uVar3 = 0;
  dVar2 = 0.0;
  while ((local_d8.longitude = ABS(dVar1) + -1.5707963267948966, uVar3 == 0 ||
         ((uVar3 < 0xf && (local_90 < dVar2))))) {
    local_108 = local_118;
    FindLinearRoot(&local_e8,&local_d8.latitude,&local_118);
    if (NAN(local_118)) {
      local_118 = local_108;
    }
    LVar6 = DestVincenty(&local_88,local_110,local_118);
    local_a8.latitude = LVar6.latitude;
    local_a8.longitude = LVar6.longitude;
    DistVincenty(&local_a8,&local_88,&local_c8);
    local_108 = local_c8.azimuth;
    DistVincenty(&local_a8,&local_48,&local_c8);
    dVar1 = local_108;
    local_f0 = local_c8.distance;
    local_e8 = local_e0;
    local_e0 = local_118;
    local_d8.latitude = local_d8.longitude;
    local_108 = local_c8.azimuth;
    dVar1 = SignAzimuthDifference(dVar1,local_c8.azimuth);
    uVar3 = uVar3 + 1;
    dVar2 = ABS(local_e0 - local_e8);
  }
  *local_68 = local_108;
  *local_60 = local_f0;
LAB_0015a6c8:
  LVar6.longitude = local_a8.longitude;
  LVar6.latitude = local_a8.latitude;
  return LVar6;
}

Assistant:

LLPoint PerpIntercept(const LLPoint &llPt1, double dCrs13, const LLPoint &llPt2,
                          double &dCrsFromPt, double &dDistFromPt, double dTol)
    {
        InverseResult result;
        LLPoint pt1 = llPt1;
        LLPoint pt2 = llPt2;
        DistVincenty(pt1, pt2, result);

        if (result.distance <= dTol)
        {
            // pt1, pt2 and projected pt3 are all the same;
            dCrsFromPt = dDistFromPt = 0.0;
            return pt1;
        }


        const double dAngle = fabs(SignAzimuthDifference(dCrs13, result.azimuth));
        double dist13 = kSphereRadius * atan(tan(result.distance / kSphereRadius) * fabs(cos(dAngle)));

        if (dAngle > M_PI_2)
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, dist13 + NmToMeters(150.0));
            dist13 = NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }
        else if (fabs(dist13) < NmToMeters(150.0))
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, NmToMeters(150.0));
            dist13 += NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }

        LLPoint pt3 = DestVincenty(pt1, dCrs13, dist13);
        DistVincenty(pt3, pt1, result);
        double crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        double crs32 = result.azimuth;
        double dist23 = result.distance;

        double errarray[2], distarray[2];
        errarray[0] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
        distarray[0] = dist13;
        distarray[1] = fabs(distarray[0] + errarray[0] * dist23);

        pt3 = DestVincenty(pt1, dCrs13, distarray[1]);
        DistVincenty(pt3, pt1, result);
        crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        crs32 = result.azimuth;

        errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;

        int k = 0;
        double dError = 0.0;
        while (k == 0 || ((dError > dTol) && (k < 15)))
        {
            double oldDist13 = dist13;
            FindLinearRoot(distarray, errarray, dist13);
            if (std::isnan(dist13))
                dist13 = oldDist13;

            pt3 = DestVincenty(pt1, dCrs13, dist13);
            DistVincenty(pt3, pt1, result);
            crs31 = result.azimuth;

            DistVincenty(pt3, pt2, result);
            dist23 = result.distance;
            crs32 = result.azimuth;

            distarray[0] = distarray[1];
            distarray[1] = dist13;
            errarray[0] = errarray[1];
            errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
            dError = fabs(distarray[1] - distarray[0]);
            k++;
        }

        dCrsFromPt = crs32;
        dDistFromPt = dist23;
        return pt3;
    }